

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O2

void Nwk_ManPrintLutSizes(Nwk_Man_t *p,If_LibLut_t *pLutLib)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int Counters [256];
  uint local_428 [258];
  
  memset(local_428,0,0x400);
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) {
      local_428[*(int *)((long)pvVar1 + 0x3c)] = local_428[*(int *)((long)pvVar1 + 0x3c)] + 1;
    }
  }
  printf("LUTs by size: ");
  for (uVar2 = 0; (long)uVar2 <= (long)pLutLib->LutMax; uVar2 = uVar2 + 1) {
    printf("%d:%d ",uVar2 & 0xffffffff,(ulong)local_428[uVar2]);
  }
  return;
}

Assistant:

void Nwk_ManPrintLutSizes( Nwk_Man_t * p, If_LibLut_t * pLutLib )
{
    Nwk_Obj_t * pObj;
    int i, Counters[256] = {0};
    Nwk_ManForEachNode( p, pObj, i )
        Counters[Nwk_ObjFaninNum(pObj)]++;
    printf( "LUTs by size: " );
    for ( i = 0; i <= pLutLib->LutMax; i++ )
        printf( "%d:%d ", i, Counters[i] );
}